

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O2

JSONNode * JSONNode::newJSONNode(JSONNode *orig)

{
  JSONNode *this;
  
  this = (JSONNode *)operator_new(8);
  JSONNode(this,orig);
  return this;
}

Assistant:

JSONNode * JSONNode::newJSONNode(const JSONNode & orig    JSON_MUTEX_COPY_DECL) {
	#ifdef JSON_MUTEX_CALLBACKS
		if (parentMutex != 0){
			JSONNode * temp = _newJSONNode(orig);
			temp -> set_mutex(parentMutex);
			return temp;
		}
	#endif
	return _newJSONNode(orig);
}